

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

UninterpretedOption_NamePart *
google::protobuf::Arena::CreateMaybeMessage<google::protobuf::UninterpretedOption_NamePart>
          (Arena *arena)

{
  UninterpretedOption_NamePart *this;
  
  if (arena == (Arena *)0x0) {
    this = (UninterpretedOption_NamePart *)operator_new(0x28);
    (this->super_Message).super_MessageLite._internal_metadata_.ptr_ = (void *)0x0;
    this->_has_bits_ = (uint32  [1])0x0;
    this->_cached_size_ = (atomic<int>)0x0;
    (this->super_Message).super_MessageLite._vptr_MessageLite =
         (_func_int **)&PTR__UninterpretedOption_NamePart_003ba078;
    if (scc_info_UninterpretedOption_NamePart_google_2fprotobuf_2fdescriptor_2eproto.base.
        visit_status.super___atomic_base<int>._M_i != 0) {
      internal::InitSCCImpl
                (&scc_info_UninterpretedOption_NamePart_google_2fprotobuf_2fdescriptor_2eproto.base)
      ;
    }
    (this->name_part_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
    this->is_extension_ = false;
  }
  else {
    if (arena->hooks_cookie_ != (void *)0x0) {
      OnArenaAllocation(arena,(type_info *)&UninterpretedOption_NamePart::typeinfo,0x28);
    }
    this = (UninterpretedOption_NamePart *)AllocateAlignedNoHook(arena,0x28);
    UninterpretedOption_NamePart::UninterpretedOption_NamePart(this,arena);
  }
  return this;
}

Assistant:

PROTOBUF_NOINLINE PROTOBUF_NAMESPACE_ID::UninterpretedOption_NamePart* Arena::CreateMaybeMessage< PROTOBUF_NAMESPACE_ID::UninterpretedOption_NamePart >(Arena* arena) {
  return Arena::CreateMessageInternal< PROTOBUF_NAMESPACE_ID::UninterpretedOption_NamePart >(arena);
}